

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O3

string * svg::attribute<char[3]>
                   (string *__return_storage_ptr__,string *attribute_name,char (*value) [3],
                   string *unit)

{
  ostream *poVar1;
  size_t sVar2;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(attribute_name->_M_dataplus)._M_p,attribute_name->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  sVar2 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*value,sVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(unit->_M_dataplus)._M_p,unit->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string attribute(std::string const & attribute_name,
        T const & value, std::string const & unit = "")
    {
        std::stringstream ss;
        ss << attribute_name << "=\"" << value << unit << "\" ";
        return ss.str();
    }